

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

void __thiscall
cmLocalUnixMakefileGenerator3::AppendCustomCommand
          (cmLocalUnixMakefileGenerator3 *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,cmCustomCommandGenerator *ccg,cmGeneratorTarget *target,string *relative,
          bool echo_comment,ostream *content)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  undefined4 uVar1;
  cmCustomCommandGenerator *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  TargetType targetType;
  char *pcVar6;
  string *psVar7;
  ulong uVar8;
  undefined4 extraout_var;
  long lVar9;
  const_reference pvVar10;
  pointer this_01;
  long lVar11;
  iterator __first;
  iterator __last;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4b8;
  const_iterator local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  string local_468 [32];
  string local_448 [8];
  string hack_cmd;
  size_type rcurly;
  size_type lcurly;
  string local_3f8;
  undefined1 local_3d8 [8];
  string shellCommand;
  string local_398;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_378;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *outputs;
  string output;
  RuleVariables vars;
  string local_220;
  char *local_200;
  char *val;
  string launcher;
  undefined1 local_1b0 [7];
  bool has_slash;
  byte local_189;
  undefined1 local_188 [7];
  bool had_slash;
  string local_168;
  undefined1 local_148 [8];
  string suffix;
  undefined1 local_120 [7];
  bool useCall;
  string cmd;
  undefined1 local_f8 [4];
  uint c;
  string currentBinDir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands1;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string workingDir;
  string dir;
  allocator<char> local_61;
  string local_60;
  char *local_40;
  char *comment;
  string *psStack_30;
  bool echo_comment_local;
  string *relative_local;
  cmGeneratorTarget *target_local;
  cmCustomCommandGenerator *ccg_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *commands_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  comment._7_1_ = echo_comment;
  psStack_30 = relative;
  relative_local = (string *)target;
  target_local = (cmGeneratorTarget *)ccg;
  ccg_local = (cmCustomCommandGenerator *)commands;
  commands_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  if (((echo_comment) &&
      (pcVar6 = cmCustomCommandGenerator::GetComment(ccg), pcVar2 = ccg_local, local_40 = pcVar6,
      pcVar6 != (char *)0x0)) && (*pcVar6 != '\0')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar6,&local_61);
    AppendEcho(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)pcVar2,&local_60,EchoGenerate,(EchoProgress *)0x0);
    std::__cxx11::string::~string((string *)&local_60);
    std::allocator<char>::~allocator(&local_61);
  }
  psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)(workingDir.field_2._M_local_buf + 8),(string *)psVar7);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_
            ((string *)&rulePlaceholderExpander,(cmCustomCommandGenerator *)target_local);
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    std::__cxx11::string::operator=
              ((string *)(workingDir.field_2._M_local_buf + 8),(string *)&rulePlaceholderExpander);
  }
  if (content != (ostream *)0x0) {
    std::operator<<(content,(string *)(workingDir.field_2._M_local_buf + 8));
  }
  iVar4 = (*(this->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[5])()
  ;
  std::unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>>::
  unique_ptr<std::default_delete<cmRulePlaceholderExpander>,void>
            ((unique_ptr<cmRulePlaceholderExpander,std::default_delete<cmRulePlaceholderExpander>> *
             )&commands1.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (pointer)CONCAT44(extraout_var,iVar4));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)&currentBinDir.field_2 + 8));
  psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)local_f8,(string *)psVar7);
  for (cmd.field_2._12_4_ = 0; uVar1 = cmd.field_2._12_4_,
      uVar5 = cmCustomCommandGenerator::GetNumberOfCommands
                        ((cmCustomCommandGenerator *)target_local), (uint)uVar1 < uVar5;
      cmd.field_2._12_4_ = cmd.field_2._12_4_ + 1) {
    cmCustomCommandGenerator::GetCommand_abi_cxx11_
              ((string *)local_120,(cmCustomCommandGenerator *)target_local,cmd.field_2._12_4_);
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      suffix.field_2._M_local_buf[0xf] = '\0';
      bVar3 = cmLocalGenerator::IsWindowsShell((cmLocalGenerator *)this);
      if (bVar3) {
        std::__cxx11::string::string((string *)local_148);
        uVar8 = std::__cxx11::string::size();
        if (4 < uVar8) {
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_188,(ulong)local_120);
          cmsys::SystemTools::LowerCase(&local_168,(string *)local_188);
          std::__cxx11::string::operator=((string *)local_148,(string *)&local_168);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)local_188);
          bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_148,".bat");
          if ((bVar3) ||
             (bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_148,".cmd"), bVar3)) {
            suffix.field_2._M_local_buf[0xf] = '\x01';
          }
        }
        std::__cxx11::string::~string((string *)local_148);
      }
      cmsys::SystemTools::ReplaceString((string *)local_120,"/./","/");
      lVar9 = std::__cxx11::string::find((char)local_120,0x2f);
      local_189 = lVar9 != -1;
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) != 0) {
        cmLocalGenerator::MaybeConvertToRelativePath
                  ((string *)local_1b0,(cmLocalGenerator *)this,(string *)local_f8,
                   (string *)local_120);
        std::__cxx11::string::operator=((string *)local_120,(string *)local_1b0);
        std::__cxx11::string::~string((string *)local_1b0);
      }
      lVar9 = std::__cxx11::string::find((char)local_120,0x2f);
      if (((local_189 & 1) != 0) && (lVar9 == -1)) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&launcher.field_2 + 8),"./",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_120);
        std::__cxx11::string::operator=
                  ((string *)local_120,(string *)(launcher.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(launcher.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::string((string *)&val);
      psVar7 = relative_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_220,"RULE_LAUNCH_CUSTOM",
                 (allocator<char> *)((long)&vars.SwiftPartialModules + 7));
      pcVar6 = cmLocalGenerator::GetRuleLauncher
                         ((cmLocalGenerator *)this,(cmGeneratorTarget *)psVar7,&local_220);
      std::__cxx11::string::~string((string *)&local_220);
      std::allocator<char>::~allocator((allocator<char> *)((long)&vars.SwiftPartialModules + 7));
      local_200 = pcVar6;
      if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
        cmRulePlaceholderExpander::RuleVariables::RuleVariables
                  ((RuleVariables *)((long)&output.field_2 + 8));
        cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)relative_local);
        output.field_2._8_8_ = std::__cxx11::string::c_str();
        targetType = cmGeneratorTarget::GetType((cmGeneratorTarget *)relative_local);
        vars.CMTargetName = cmState::GetTargetTypeName(targetType);
        std::__cxx11::string::string((string *)&outputs);
        local_378 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                              ((cmCustomCommandGenerator *)target_local);
        bVar3 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(local_378);
        if (!bVar3) {
          pvVar10 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](local_378,0);
          std::__cxx11::string::operator=((string *)&outputs,(string *)pvVar10);
          uVar8 = std::__cxx11::string::empty();
          if ((uVar8 & 1) != 0) {
            psVar7 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                               ((cmLocalGenerator *)this);
            cmLocalGenerator::MaybeConvertToRelativePath
                      (&local_398,(cmLocalGenerator *)this,psVar7,(string *)&outputs);
            std::__cxx11::string::operator=((string *)&outputs,(string *)&local_398);
            std::__cxx11::string::~string((string *)&local_398);
          }
          cmOutputConverter::ConvertToOutputFormat
                    ((string *)((long)&shellCommand.field_2 + 8),
                     &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                      super_cmOutputConverter,(string *)&outputs,SHELL);
          std::__cxx11::string::operator=
                    ((string *)&outputs,(string *)(shellCommand.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(shellCommand.field_2._M_local_buf + 8));
        }
        vars.PreprocessedSource = (char *)std::__cxx11::string::c_str();
        std::__cxx11::string::operator=((string *)&val,local_200);
        this_01 = std::
                  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                  ::operator->((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                                *)&commands1.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmRulePlaceholderExpander::ExpandRuleVariables
                  (this_01,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                            super_cmOutputConverter,(string *)&val,
                   (RuleVariables *)((long)&output.field_2 + 8));
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)&val," ");
        }
        std::__cxx11::string::~string((string *)&outputs);
      }
      MaybeConvertWatcomShellCommand((string *)local_3d8,this,(string *)local_120);
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) != 0) {
        cmOutputConverter::ConvertToOutputFormat
                  (&local_3f8,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,(string *)local_120,SHELL);
        std::__cxx11::string::operator=((string *)local_3d8,(string *)&local_3f8);
        std::__cxx11::string::~string((string *)&local_3f8);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lcurly,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8)
      ;
      std::__cxx11::string::operator=((string *)local_120,(string *)&lcurly);
      std::__cxx11::string::~string((string *)&lcurly);
      cmCustomCommandGenerator::AppendArguments
                ((cmCustomCommandGenerator *)target_local,cmd.field_2._12_4_,(string *)local_120);
      if (content != (ostream *)0x0) {
        lVar9 = std::__cxx11::string::c_str();
        lVar11 = std::__cxx11::string::size();
        std::operator<<(content,(char *)(lVar9 + lVar11));
      }
      if (((((this->BorlandMakeCurlyHack & 1U) != 0) &&
           (uVar8 = std::__cxx11::string::find((char)local_120,0x7b), uVar8 != 0xffffffffffffffff))
          && (lVar9 = std::__cxx11::string::size(), uVar8 < lVar9 - 1U)) &&
         ((hack_cmd.field_2._8_8_ = std::__cxx11::string::find((char)local_120,0x7d),
          hack_cmd.field_2._8_8_ == 0xffffffffffffffff || (uVar8 < (ulong)hack_cmd.field_2._8_8_))))
      {
        std::__cxx11::string::substr((ulong)local_448,(ulong)local_120);
        std::__cxx11::string::operator+=(local_448,"{{}");
        std::__cxx11::string::substr((ulong)local_468,(ulong)local_120);
        std::__cxx11::string::operator+=(local_448,local_468);
        std::__cxx11::string::~string(local_468);
        std::__cxx11::string::operator=((string *)local_120,local_448);
        std::__cxx11::string::~string(local_448);
      }
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) != 0) {
        if ((suffix.field_2._M_local_buf[0xf] & 1U) == 0) {
          bVar3 = cmLocalGenerator::IsNMake((cmLocalGenerator *)this);
          if ((bVar3) &&
             (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)local_120), *pcVar6 == '\"'))
          {
            std::operator+(&local_4a8,"echo >nul && ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_120);
            std::__cxx11::string::operator=((string *)local_120,(string *)&local_4a8);
            std::__cxx11::string::~string((string *)&local_4a8);
          }
        }
        else {
          std::operator+(&local_488,"call ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_120);
          std::__cxx11::string::operator=((string *)local_120,(string *)&local_488);
          std::__cxx11::string::~string((string *)&local_488);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&currentBinDir.field_2 + 8),(value_type *)local_120);
      std::__cxx11::string::~string((string *)local_3d8);
      std::__cxx11::string::~string((string *)&val);
    }
    std::__cxx11::string::~string((string *)local_120);
  }
  CreateCDCommand(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&currentBinDir.field_2 + 8),
                  (string *)((long)&workingDir.field_2 + 8),psStack_30);
  pcVar2 = ccg_local;
  local_4b8._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ccg_local);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_4b0,&local_4b8);
  this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&currentBinDir.field_2 + 8);
  __first = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin(this_00);
  __last = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(this_00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)pcVar2,local_4b0,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__first._M_current,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )__last._M_current);
  std::__cxx11::string::~string((string *)local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&currentBinDir.field_2 + 8));
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr((unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               *)&commands1.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&rulePlaceholderExpander);
  std::__cxx11::string::~string((string *)(workingDir.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::AppendCustomCommand(
  std::vector<std::string>& commands, cmCustomCommandGenerator const& ccg,
  cmGeneratorTarget* target, std::string const& relative, bool echo_comment,
  std::ostream* content)
{
  // Optionally create a command to display the custom command's
  // comment text.  This is used for pre-build, pre-link, and
  // post-build command comments.  Custom build step commands have
  // their comments generated elsewhere.
  if (echo_comment) {
    const char* comment = ccg.GetComment();
    if (comment && *comment) {
      this->AppendEcho(commands, comment,
                       cmLocalUnixMakefileGenerator3::EchoGenerate);
    }
  }

  // if the command specified a working directory use it.
  std::string dir = this->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }
  if (content) {
    *content << dir;
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->CreateRulePlaceholderExpander());

  // Add each command line to the set of commands.
  std::vector<std::string> commands1;
  std::string currentBinDir = this->GetCurrentBinaryDirectory();
  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

      if (this->IsWindowsShell()) {
        std::string suffix;
        if (cmd.size() > 4) {
          suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
          if (suffix == ".bat" || suffix == ".cmd") {
            useCall = true;
          }
        }
      }

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->MaybeConvertToRelativePath(currentBinDir, cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = "./" + cmd;
      }

      std::string launcher;
      // Short-circuit if there is no launcher.
      const char* val = this->GetRuleLauncher(target, "RULE_LAUNCH_CUSTOM");
      if (val && *val) {
        // Expand rule variables referenced in the given launcher command.
        cmRulePlaceholderExpander::RuleVariables vars;
        vars.CMTargetName = target->GetName().c_str();
        vars.CMTargetType = cmState::GetTargetTypeName(target->GetType());
        std::string output;
        const std::vector<std::string>& outputs = ccg.GetOutputs();
        if (!outputs.empty()) {
          output = outputs[0];
          if (workingDir.empty()) {
            output = this->MaybeConvertToRelativePath(
              this->GetCurrentBinaryDirectory(), output);
          }
          output =
            this->ConvertToOutputFormat(output, cmOutputConverter::SHELL);
        }
        vars.Output = output.c_str();

        launcher = val;
        rulePlaceholderExpander->ExpandRuleVariables(this, launcher, vars);
        if (!launcher.empty()) {
          launcher += " ";
        }
      }

      std::string shellCommand = this->MaybeConvertWatcomShellCommand(cmd);
      if (shellCommand.empty()) {
        shellCommand =
          this->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL);
      }
      cmd = launcher + shellCommand;

      ccg.AppendArguments(c, cmd);
      if (content) {
        // Rule content does not include the launcher.
        *content << (cmd.c_str() + launcher.size());
      }
      if (this->BorlandMakeCurlyHack) {
        // Borland Make has a very strange bug.  If the first curly
        // brace anywhere in the command string is a left curly, it
        // must be written {{} instead of just {.  Otherwise some
        // curly braces are removed.  The hack can be skipped if the
        // first curly brace is the last character.
        std::string::size_type lcurly = cmd.find('{');
        if (lcurly != std::string::npos && lcurly < (cmd.size() - 1)) {
          std::string::size_type rcurly = cmd.find('}');
          if (rcurly == std::string::npos || rcurly > lcurly) {
            // The first curly is a left curly.  Use the hack.
            std::string hack_cmd = cmd.substr(0, lcurly);
            hack_cmd += "{{}";
            hack_cmd += cmd.substr(lcurly + 1);
            cmd = hack_cmd;
          }
        }
      }
      if (launcher.empty()) {
        if (useCall) {
          cmd = "call " + cmd;
        } else if (this->IsNMake() && cmd[0] == '"') {
          cmd = "echo >nul && " + cmd;
        }
      }
      commands1.push_back(std::move(cmd));
    }
  }

  // Setup the proper working directory for the commands.
  this->CreateCDCommand(commands1, dir, relative);

  // push back the custom commands
  commands.insert(commands.end(), commands1.begin(), commands1.end());
}